

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::GetFullExtensionName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  size_type *psVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  FieldDescriptor **ppFVar5;
  FieldDescriptor *pFVar6;
  undefined8 uVar7;
  FieldDescriptor **local_78;
  FieldDescriptor *local_70;
  FieldDescriptor *local_68;
  long lStack_60;
  string local_58;
  string local_38;
  
  lVar2 = *(long *)(this + 0x60);
  if (lVar2 == 0) {
    GetExtensionClassUnqualifiedName_abi_cxx11_
              (&local_38,*(csharp **)(this + 0x28),(FileDescriptor *)descriptor);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_38);
    ppFVar5 = (FieldDescriptor **)(puVar4 + 2);
    if ((FieldDescriptor **)*puVar4 == ppFVar5) {
      local_68 = *ppFVar5;
      lStack_60 = puVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *ppFVar5;
      local_78 = (FieldDescriptor **)*puVar4;
    }
    local_70 = (FieldDescriptor *)puVar4[1];
    *puVar4 = ppFVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    GetPropertyName_abi_cxx11_(&local_58,this,local_70);
    pFVar6 = (FieldDescriptor *)0xf;
    if (local_78 != &local_68) {
      pFVar6 = local_68;
    }
    if (pFVar6 < local_70 + local_58._M_string_length) {
      uVar7 = (FieldDescriptor *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        uVar7 = local_58.field_2._M_allocated_capacity;
      }
      if (local_70 + local_58._M_string_length <= (ulong)uVar7) {
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
        goto LAB_0023d788;
      }
    }
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
  }
  else {
    ToCSharpName(&local_38,*(string **)(lVar2 + 8),*(FileDescriptor **)(lVar2 + 0x10));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
    ppFVar5 = (FieldDescriptor **)(plVar3 + 2);
    if ((FieldDescriptor **)*plVar3 == ppFVar5) {
      local_68 = *ppFVar5;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *ppFVar5;
      local_78 = (FieldDescriptor **)*plVar3;
    }
    local_70 = (FieldDescriptor *)plVar3[1];
    *plVar3 = (long)ppFVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    GetPropertyName_abi_cxx11_(&local_58,this,local_70);
    pFVar6 = (FieldDescriptor *)0xf;
    if (local_78 != &local_68) {
      pFVar6 = local_68;
    }
    if (pFVar6 < local_70 + local_58._M_string_length) {
      uVar7 = (FieldDescriptor *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        uVar7 = local_58.field_2._M_allocated_capacity;
      }
      if (local_70 + local_58._M_string_length <= (ulong)uVar7) {
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
        goto LAB_0023d788;
      }
    }
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
  }
LAB_0023d788:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar7 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullExtensionName(const FieldDescriptor* descriptor) {
  if (descriptor->extension_scope()) {
    return GetClassName(descriptor->extension_scope()) + ".Extensions." + GetPropertyName(descriptor);
  }
  else {
    return GetExtensionClassUnqualifiedName(descriptor->file())  + "." + GetPropertyName(descriptor);
  }
}